

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O0

void t8(void)

{
  undefined4 in_EAX;
  undefined4 uVar1;
  int iVar2;
  int v;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  undefined4 uVar3;
  char *pcVar4;
  
  printf("Bank read/write tests.\n");
  gpio_write(0x19,0);
  uVar1 = read_bank_1();
  pcVar4 = (char *)(CONCAT44(uVar1,in_EAX) & 0x2000000ffffffff);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  gpio_write(0x19,1);
  uVar1 = read_bank_1();
  pcVar4 = (char *)(CONCAT44(uVar1,uVar3) & 0x2000000ffffffff);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  clear_bank_1(0x2000000);
  uVar1 = gpio_read(0x19);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  set_bank_1(0x2000000);
  uVar1 = gpio_read(0x19);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  iVar2 = read_bank_2();
  if (iVar2 == 0) {
    pcVar4 = (char *)CONCAT44(1,(int)pcVar4);
  }
  else {
    pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
  }
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  uVar1 = clear_bank_2(0);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  uVar1 = clear_bank_2(0xffffff);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  uVar1 = set_bank_2(0);
  pcVar4 = (char *)CONCAT44(uVar1,uVar3);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar4);
  uVar3 = SUB84(pcVar4,0);
  uVar1 = set_bank_2(0xffffff);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,
        (char *)CONCAT44(uVar1,uVar3));
  return;
}

Assistant:

void t8()
{
   int v;

   printf("Bank read/write tests.\n");

   gpio_write(GPIO, 0);
   v = read_bank_1() & (1<<GPIO);
   CHECK(8, 1, v, 0, 0, "read bank 1");

   gpio_write(GPIO, 1);
   v = read_bank_1() & (1<<GPIO);
   CHECK(8, 2, v, (1<<GPIO), 0, "read bank 1");

   clear_bank_1(1<<GPIO);
   v = gpio_read(GPIO);
   CHECK(8, 3, v, 0, 0, "clear bank 1");

   set_bank_1(1<<GPIO);
   v = gpio_read(GPIO);
   CHECK(8, 4, v, 1, 0, "set bank 1");

   v = read_bank_2();

   if (v) v = 0; else v = 1;

   CHECK(8, 5, v, 0, 0, "read bank 2");

   v = clear_bank_2(0);
   CHECK(8, 6, v, 0, 0, "clear bank 2");

   v = clear_bank_2(0xffffff);
   CHECK(8, 7, v, PI_SOME_PERMITTED, 0, "clear bank 2");

   v = set_bank_2(0);
   CHECK(8, 8, v, 0, 0, "set bank 2");

   v = set_bank_2(0xffffff);
   CHECK(8, 9, v, PI_SOME_PERMITTED, 0, "set bank 2");
}